

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::native(Twine *path,SmallVectorImpl<char> *result,Style style)

{
  bool bVar1;
  char *pcVar2;
  pointer pcVar3;
  StringRef local_30;
  Style local_1c;
  SmallVectorTemplateCommon<char,_void> *pSStack_18;
  Style style_local;
  SmallVectorImpl<char> *result_local;
  Twine *path_local;
  
  local_1c = style;
  pSStack_18 = (SmallVectorTemplateCommon<char,_void> *)result;
  result_local = (SmallVectorImpl<char> *)path;
  bVar1 = Twine::isSingleStringRef(path);
  if (bVar1) {
    local_30 = Twine::getSingleStringRef((Twine *)result_local);
    pcVar2 = StringRef::data(&local_30);
    pcVar3 = SmallVectorTemplateCommon<char,_void>::data(pSStack_18);
    bVar1 = false;
    if (pcVar2 == pcVar3) goto LAB_0288b071;
  }
  bVar1 = true;
LAB_0288b071:
  if (bVar1) {
    SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)pSStack_18);
    Twine::toVector((Twine *)result_local,(SmallVectorImpl<char> *)pSStack_18);
    native((SmallVectorImpl<char> *)pSStack_18,local_1c);
    return;
  }
  __assert_fail("(!path.isSingleStringRef() || path.getSingleStringRef().data() != result.data()) && \"path and result are not allowed to overlap!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Path.cpp"
                ,0x1e0,"void llvm::sys::path::native(const Twine &, SmallVectorImpl<char> &, Style)"
               );
}

Assistant:

void native(const Twine &path, SmallVectorImpl<char> &result, Style style) {
  assert((!path.isSingleStringRef() ||
          path.getSingleStringRef().data() != result.data()) &&
         "path and result are not allowed to overlap!");
  // Clear result.
  result.clear();
  path.toVector(result);
  native(result, style);
}